

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhCellWriteOvflPayload(lhcell *pCell,void *pKey,sxu32 nKeylen,...)

{
  char in_AL;
  uint uVar1;
  uchar *puVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  long *local_198;
  long *local_180;
  undefined1 local_168 [24];
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  long local_b8;
  sxu64 nData;
  uchar *puStack_a8;
  sxu32 nDatalen;
  void *pData;
  uint local_98;
  int rc;
  va_list ap;
  uchar *puStack_70;
  sxu32 nAvail;
  uchar *zRawEnd;
  uchar *zRaw;
  uchar *zEnd;
  uchar *zPtr;
  unqlite_page *pNew;
  unqlite_page *pFirst;
  unqlite_page *pOvfl;
  lhash_kv_engine *pEngine;
  lhpage *pPage;
  uchar *puStack_20;
  sxu32 nKeylen_local;
  void *pKey_local;
  lhcell *pCell_local;
  
  if (in_AL != '\0') {
    local_138 = in_XMM0_Qa;
    local_128 = in_XMM1_Qa;
    local_118 = in_XMM2_Qa;
    local_108 = in_XMM3_Qa;
    local_f8 = in_XMM4_Qa;
    local_e8 = in_XMM5_Qa;
    local_d8 = in_XMM6_Qa;
    local_c8 = in_XMM7_Qa;
  }
  pEngine = (lhash_kv_engine *)pCell->pPage;
  pOvfl = (unqlite_page *)pEngine->pIo;
  local_150 = in_RCX;
  local_148 = in_R8;
  local_140 = in_R9;
  pPage._4_4_ = nKeylen;
  puStack_20 = (uchar *)pKey;
  pKey_local = pCell;
  pData._4_4_ = lhAcquirePage((lhash_kv_engine *)pOvfl,&pFirst);
  pCell_local._4_4_ = pData._4_4_;
  if ((pData._4_4_ == 0) &&
     (pData._4_4_ = (**(code **)(pOvfl->zData + 0x28))(pFirst), pCell_local._4_4_ = pData._4_4_,
     pData._4_4_ == 0)) {
    pNew = pFirst;
    *(pgno *)((long)pKey_local + 0x18) = pFirst->iPage;
    SyBigEndianPack64((uchar *)(((pEngine->sAllocator).pMutexMethods)->xGlobalInit +
                               (int)(*(ushort *)((long)pKey_local + 0x28) + 0x12)),
                      *(sxu64 *)((long)pKey_local + 0x18));
    zEnd = puStack_20;
    puVar2 = puStack_20 + pPage._4_4_;
    SyBigEndianPack64(pFirst->zData,0);
    zRawEnd = pFirst->zData + 0x12;
    puStack_70 = pFirst->zData + *(int *)&pOvfl[0xb].pUserData;
    zPtr = (uchar *)pFirst;
    for (; zEnd < puVar2; zEnd = zEnd + pPage._4_4_) {
      if (puStack_70 <= zRawEnd) {
        pData._4_4_ = lhAcquirePage((lhash_kv_engine *)pOvfl,(unqlite_page **)&zPtr);
        if (pData._4_4_ != 0) {
          return pData._4_4_;
        }
        pData._4_4_ = (**(code **)(pOvfl->zData + 0x28))(zPtr);
        if (pData._4_4_ != 0) {
          return pData._4_4_;
        }
        SyBigEndianPack64(pFirst->zData,*(sxu64 *)(zPtr + 0x10));
        (**(code **)(pOvfl->zData + 0x50))(pFirst);
        SyBigEndianPack64(*(uchar **)zPtr,0);
        pFirst = (unqlite_page *)zPtr;
        zRawEnd = (uchar *)(*(long *)zPtr + 8);
        puStack_70 = (uchar *)(*(long *)zPtr + (long)*(int *)&pOvfl[0xb].pUserData);
      }
      uVar1 = (int)puStack_70 - (int)zRawEnd;
      pPage._4_4_ = (int)puVar2 - (int)zEnd;
      if (uVar1 < pPage._4_4_) {
        pPage._4_4_ = uVar1;
      }
      SyMemcpy(zEnd,zRawEnd,pPage._4_4_);
      zRawEnd = zRawEnd + pPage._4_4_;
    }
    pData._4_4_ = 0;
    ap[0].overflow_arg_area = local_168;
    ap[0]._0_8_ = &stack0x00000008;
    rc = 0x30;
    local_98 = 0x18;
    *(undefined8 *)((long)pKey_local + 0x30) = *(undefined8 *)(zPtr + 0x10);
    *(short *)((long)pKey_local + 0x38) = (short)zRawEnd - (short)*(undefined8 *)zPtr;
    SyBigEndianPack64(pNew->zData + 8,*(sxu64 *)((long)pKey_local + 0x30));
    SyBigEndianPack16(pNew->zData + 0x10,*(sxu16 *)((long)pKey_local + 0x38));
    while( true ) {
      if (local_98 < 0x29) {
        local_180 = (long *)((long)(int)local_98 + (long)ap[0].overflow_arg_area);
        local_98 = local_98 + 8;
      }
      else {
        local_180 = (long *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      puStack_a8 = (uchar *)*local_180;
      if (local_98 < 0x29) {
        local_198 = (long *)((long)(int)local_98 + (long)ap[0].overflow_arg_area);
        local_98 = local_98 + 8;
      }
      else {
        local_198 = (long *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      local_b8 = *local_198;
      if (puStack_a8 == (uchar *)0x0) break;
      puVar2 = puStack_a8 + local_b8;
      for (zEnd = puStack_a8; zEnd < puVar2; zEnd = zEnd + nData._4_4_) {
        if (puStack_70 <= zRawEnd) {
          pData._4_4_ = lhAcquirePage((lhash_kv_engine *)pOvfl,(unqlite_page **)&zPtr);
          if (pData._4_4_ != 0) {
            return pData._4_4_;
          }
          pData._4_4_ = (**(code **)(pOvfl->zData + 0x28))(zPtr);
          if (pData._4_4_ != 0) {
            return pData._4_4_;
          }
          SyBigEndianPack64(pFirst->zData,*(sxu64 *)(zPtr + 0x10));
          (**(code **)(pOvfl->zData + 0x50))(pFirst);
          SyBigEndianPack64(*(uchar **)zPtr,0);
          pFirst = (unqlite_page *)zPtr;
          zRawEnd = (uchar *)(*(long *)zPtr + 8);
          puStack_70 = (uchar *)(*(long *)zPtr + (long)*(int *)&pOvfl[0xb].pUserData);
        }
        uVar1 = (int)puStack_70 - (int)zRawEnd;
        nData._4_4_ = (int)puVar2 - (int)zEnd;
        if (uVar1 < nData._4_4_) {
          nData._4_4_ = uVar1;
        }
        SyMemcpy(zEnd,zRawEnd,nData._4_4_);
        zRawEnd = zRawEnd + nData._4_4_;
      }
    }
    (**(code **)(pOvfl->zData + 0x50))(pFirst);
    pCell_local._4_4_ = 0;
  }
  return pCell_local._4_4_;
}

Assistant:

static int lhCellWriteOvflPayload(lhcell *pCell,const void *pKey,sxu32 nKeylen,...)
{
	lhpage *pPage = pCell->pPage;
	lhash_kv_engine *pEngine = pPage->pHash;
	unqlite_page *pOvfl,*pFirst,*pNew;
	const unsigned char *zPtr,*zEnd;
	unsigned char *zRaw,*zRawEnd;
	sxu32 nAvail;
	va_list ap;
	int rc;
	/* Acquire a new overflow page */
	rc = lhAcquirePage(pEngine,&pOvfl);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Acquire a writer lock */
	rc = pEngine->pIo->xWrite(pOvfl);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	pFirst = pOvfl;
	/* Link */
	pCell->iOvfl = pOvfl->iPage;
	/* Update the cell header */
	SyBigEndianPack64(&pPage->pRaw->zData[pCell->iStart + 4/*Hash*/ + 4/*Key*/ + 8/*Data*/ + 2 /*Next cell*/],pCell->iOvfl);
	/* Start the write process */
	zPtr = (const unsigned char *)pKey;
	zEnd = &zPtr[nKeylen];
	SyBigEndianPack64(pOvfl->zData,0); /* Next overflow page on the chain */
	zRaw = &pOvfl->zData[8/* Next ovfl page*/ + 8 /* Data page */ + 2 /* Data offset*/];
	zRawEnd = &pOvfl->zData[pEngine->iPageSize];
	pNew = pOvfl;
	/* Write the key */
	for(;;){
		if( zPtr >= zEnd ){
			break;
		}
		if( zRaw >= zRawEnd ){
			/* Acquire a new page */
			rc = lhAcquirePage(pEngine,&pNew);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			rc = pEngine->pIo->xWrite(pNew);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			/* Link */
			SyBigEndianPack64(pOvfl->zData,pNew->iPage);
			pEngine->pIo->xPageUnref(pOvfl);
			SyBigEndianPack64(pNew->zData,0); /* Next overflow page on the chain */
			pOvfl = pNew;
			zRaw = &pNew->zData[8];
			zRawEnd = &pNew->zData[pEngine->iPageSize];
		}
		nAvail = (sxu32)(zRawEnd-zRaw);
		nKeylen = (sxu32)(zEnd-zPtr);
		if( nKeylen > nAvail ){
			nKeylen = nAvail;
		}
		SyMemcpy((const void *)zPtr,(void *)zRaw,nKeylen);
		/* Synchronize pointers */
		zPtr += nKeylen;
		zRaw += nKeylen;
	}
	rc = UNQLITE_OK;
	va_start(ap,nKeylen);
	pCell->iDataPage = pNew->iPage;
	pCell->iDataOfft = (sxu16)(zRaw-pNew->zData);
	/* Write the data page and its offset */
	SyBigEndianPack64(&pFirst->zData[8/*Next ovfl*/],pCell->iDataPage);
	SyBigEndianPack16(&pFirst->zData[8/*Next ovfl*/+8/*Data page*/],pCell->iDataOfft);
	/* Write data */
	for(;;){
		const void *pData;
		sxu32 nDatalen;
		sxu64 nData;
		pData = va_arg(ap,const void *);
		nData = va_arg(ap,sxu64);
		if( pData == 0 ){
			/* No more chunks */
			break;
		}
		/* Write this chunk */
		zPtr = (const unsigned char *)pData;
		zEnd = &zPtr[nData];
		for(;;){
			if( zPtr >= zEnd ){
				break;
			}
			if( zRaw >= zRawEnd ){
				/* Acquire a new page */
				rc = lhAcquirePage(pEngine,&pNew);
				if( rc != UNQLITE_OK ){
					va_end(ap);
					return rc;
				}
				rc = pEngine->pIo->xWrite(pNew);
				if( rc != UNQLITE_OK ){
					va_end(ap);
					return rc;
				}
				/* Link */
				SyBigEndianPack64(pOvfl->zData,pNew->iPage);
				pEngine->pIo->xPageUnref(pOvfl);
				SyBigEndianPack64(pNew->zData,0); /* Next overflow page on the chain */
				pOvfl = pNew;
				zRaw = &pNew->zData[8];
				zRawEnd = &pNew->zData[pEngine->iPageSize];
			}
			nAvail = (sxu32)(zRawEnd-zRaw);
			nDatalen = (sxu32)(zEnd-zPtr);
			if( nDatalen > nAvail ){
				nDatalen = nAvail;
			}
			SyMemcpy((const void *)zPtr,(void *)zRaw,nDatalen);
			/* Synchronize pointers */
			zPtr += nDatalen;
			zRaw += nDatalen;
		}
	}
	/* Unref the overflow page */
	pEngine->pIo->xPageUnref(pOvfl);
	va_end(ap);
	return UNQLITE_OK;
}